

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O3

void __thiscall
fmp4_stream::emsg::write_emsg_as_mpd_event(emsg *this,ostream *ostr,uint64_t base_time)

{
  uchar *puVar1;
  int iVar2;
  ostream *poVar3;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(ostr,"<event ",7);
  std::__ostream_insert<char,std::char_traits<char>>(ostr,"presentationtime=",0x11);
  local_50._M_dataplus._M_p._0_1_ = 0x22;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(ostr,(char *)&local_50,1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  local_50._M_dataplus._M_p._0_1_ = 0x22;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"duration=",9);
  local_50._M_dataplus._M_p._0_1_ = 0x22;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  local_50._M_dataplus._M_p._0_1_ = 0x22;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"id=",3);
  local_50._M_dataplus._M_p._0_1_ = 0x22;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  local_50._M_dataplus._M_p._0_1_ = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
  iVar2 = std::__cxx11::string::compare((char *)&this->scheme_id_uri_);
  if (iVar2 == 0) {
    local_50._M_dataplus._M_p._0_1_ = 0x3e;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(ostr,(char *)&local_50,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  <signal xmlns=",0x10);
    local_50._M_dataplus._M_p._0_1_ = 0x22;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"http://www.scte.org/schemas/35/2016",0x23);
    local_50._M_dataplus._M_p._0_1_ = 0x22;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
    local_50._M_dataplus._M_p._0_1_ = 0x3e;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    <binary>",0xc);
    puVar1 = (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    base64_encode_abi_cxx11_
              (&local_50,puVar1,
               (ulong)(uint)(*(int *)&(this->message_data_).
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (int)puVar1));
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                local_50._M_dataplus._M_p._0_1_),
                        local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</binary>",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  </signal>",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(ostr," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(ostr,"contentencoding=",0x10);
    local_50._M_dataplus._M_p._0_1_ = 0x22;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(ostr,(char *)&local_50,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"base64",6);
    local_50._M_dataplus._M_p._0_1_ = 0x22;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
    local_50._M_dataplus._M_p._0_1_ = 0x3e;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    puVar1 = (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    base64_encode_abi_cxx11_
              (&local_50,puVar1,
               (ulong)(uint)(*(int *)&(this->message_data_).
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (int)puVar1));
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                local_50._M_dataplus._M_p._0_1_),
                        local_50._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_));
  }
  std::__ostream_insert<char,std::char_traits<char>>(ostr,"</event>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)ostr + -0x18) + (char)ostr);
  std::ostream::put((char)ostr);
  std::ostream::flush();
  return;
}

Assistant:

void emsg::write_emsg_as_mpd_event(std::ostream &ostr, uint64_t base_time) const
	{
		ostr << "<event "
			<< "presentationtime=" << '"' << (this->version_ ? presentation_time_ : base_time + presentation_time_delta_) << '"' << " "  \
			<< "duration=" << '"' << event_duration_ << '"' << " "  \
			<< "id=" << '"' << id_ << '"';
		if (this->scheme_id_uri_.compare("urn:scte:scte35:2013:bin") == 0) // write binary scte as xml + bin as defined by scte-35
		{
			ostr << '>' << std::endl << "  <signal xmlns=" << '"' << "http://www.scte.org/schemas/35/2016" << '"' << '>' << std::endl \
				<< "    <binary>" << base64_encode(this->message_data_.data(), (unsigned int)this->message_data_.size()) << "</binary>" << std::endl
				<< "  </signal>" << std::endl;
		}
		else {
			ostr << " " << "contentencoding=" << '"' << "base64" << '"' << '>' << std::endl
				<< base64_encode(this->message_data_.data(), (unsigned int)this->message_data_.size()) << std::endl;
		}
		ostr << "</event>" << std::endl;
	}